

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool kj::Path::isWin32Special(StringPtr part)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  bool local_ba;
  bool local_b9;
  StringPtr local_b8;
  StringPtr local_a8;
  StringPtr local_98;
  StringPtr local_88;
  StringPtr local_78;
  StringPtr local_68;
  undefined1 local_58 [8];
  StringPtr str;
  char *c;
  char *__end1;
  char *__begin1;
  char (*__range1) [4];
  undefined1 auStack_20 [3];
  char tmp [4];
  bool isNumbered;
  StringPtr part_local;
  
  _auStack_20 = part.content.ptr;
  sVar3 = StringPtr::size((StringPtr *)auStack_20);
  if (sVar3 == 3) {
LAB_009ec1c7:
    __range1._7_1_ = 0;
LAB_009ec242:
    pcVar4 = StringPtr::begin((StringPtr *)auStack_20);
    __range1._3_2_ = *(undefined2 *)pcVar4;
    __range1._5_1_ = pcVar4[2];
    __range1._6_1_ = 0;
    for (__end1 = (char *)((long)&__range1 + 3); __end1 != (char *)((long)&__range1 + 7);
        __end1 = __end1 + 1) {
      str.content.size_ = (size_t)__end1;
      if (('@' < *__end1) && (*__end1 < '[')) {
        *__end1 = *__end1 + ' ';
      }
    }
    StringPtr::StringPtr((StringPtr *)local_58,(char *)((long)&__range1 + 3),3);
    if ((__range1._7_1_ & 1) == 0) {
      StringPtr::StringPtr(&local_88,"con");
      bVar2 = StringPtr::operator==((StringPtr *)local_58,&local_88);
      local_ba = true;
      if (!bVar2) {
        StringPtr::StringPtr(&local_98,"prn");
        bVar2 = StringPtr::operator==((StringPtr *)local_58,&local_98);
        local_ba = true;
        if (!bVar2) {
          StringPtr::StringPtr(&local_a8,"aux");
          bVar2 = StringPtr::operator==((StringPtr *)local_58,&local_a8);
          local_ba = true;
          if (!bVar2) {
            StringPtr::StringPtr(&local_b8,"nul");
            local_ba = StringPtr::operator==((StringPtr *)local_58,&local_b8);
          }
        }
      }
      part_local.content.size_._7_1_ = local_ba;
    }
    else {
      StringPtr::StringPtr(&local_68,"com");
      bVar2 = StringPtr::operator==((StringPtr *)local_58,&local_68);
      local_b9 = true;
      if (!bVar2) {
        StringPtr::StringPtr(&local_78,"lpt");
        local_b9 = StringPtr::operator==((StringPtr *)local_58,&local_78);
      }
      part_local.content.size_._7_1_ = local_b9;
    }
  }
  else {
    sVar3 = StringPtr::size((StringPtr *)auStack_20);
    if (3 < sVar3) {
      cVar1 = StringPtr::operator[]((StringPtr *)auStack_20,3);
      if (cVar1 == '.') goto LAB_009ec1c7;
    }
    sVar3 = StringPtr::size((StringPtr *)auStack_20);
    if (sVar3 == 4) {
LAB_009ec201:
      cVar1 = StringPtr::operator[]((StringPtr *)auStack_20,3);
      if ('0' < cVar1) {
        cVar1 = StringPtr::operator[]((StringPtr *)auStack_20,3);
        if (cVar1 < ':') {
          __range1._7_1_ = 1;
          goto LAB_009ec242;
        }
      }
    }
    else {
      sVar3 = StringPtr::size((StringPtr *)auStack_20);
      if (4 < sVar3) {
        cVar1 = StringPtr::operator[]((StringPtr *)auStack_20,4);
        if (cVar1 == '.') goto LAB_009ec201;
      }
    }
    part_local.content.size_._7_1_ = false;
  }
  return part_local.content.size_._7_1_;
}

Assistant:

bool Path::isWin32Special(StringPtr part) {
  bool isNumbered;
  if (part.size() == 3 || (part.size() > 3 && part[3] == '.')) {
    // Filename is three characters or three characters followed by an extension.
    isNumbered = false;
  } else if ((part.size() == 4 || (part.size() > 4 && part[4] == '.')) &&
             '1' <= part[3] && part[3] <= '9') {
    // Filename is four characters or four characters followed by an extension, and the fourth
    // character is a nonzero digit.
    isNumbered = true;
  } else {
    return false;
  }

  // OK, this could be a Win32 special filename. We need to match the first three letters against
  // the list of specials, case-insensitively.
  char tmp[4];
  memcpy(tmp, part.begin(), 3);
  tmp[3] = '\0';
  for (char& c: tmp) {
    if ('A' <= c && c <= 'Z') {
      c += 'a' - 'A';
    }
  }

  StringPtr str(tmp, 3);
  if (isNumbered) {
    // Specials that are followed by a digit.
    return str == "com" || str == "lpt";
  } else {
    // Specials that are not followed by a digit.
    return str == "con" || str == "prn" || str == "aux" || str == "nul";
  }
}